

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O3

string * __thiscall
glslang::TSourceLoc::getStringNameOrNum_abi_cxx11_
          (string *__return_storage_ptr__,TSourceLoc *this,bool quoteStringName)

{
  int iVar1;
  size_type *psVar2;
  pointer pcVar3;
  bool bVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar7;
  ulong uVar8;
  uint __len;
  ulong __val;
  ulong uVar9;
  TString qstr;
  TPoolAllocator *local_70;
  size_type *local_68;
  size_type local_60;
  size_type local_58;
  undefined8 uStack_50;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_48;
  
  pbVar6 = this->name;
  if (pbVar6 == (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)0x0) {
    iVar1 = this->string;
    uVar9 = (ulong)iVar1;
    __val = -uVar9;
    if (0 < (long)uVar9) {
      __val = uVar9;
    }
    __len = 1;
    if (9 < __val) {
      uVar8 = __val;
      uVar5 = 4;
      do {
        __len = uVar5;
        if (uVar8 < 100) {
          __len = __len - 2;
          goto LAB_003e92d3;
        }
        if (uVar8 < 1000) {
          __len = __len - 1;
          goto LAB_003e92d3;
        }
        if (uVar8 < 10000) goto LAB_003e92d3;
        bVar4 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        uVar5 = __len + 4;
      } while (bVar4);
      __len = __len + 1;
    }
LAB_003e92d3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)__len - (char)(iVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              ((__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar9 >> 0x3f),__len,__val);
  }
  else {
    if (quoteStringName) {
      std::operator+(&local_48,"\"",pbVar6);
      pbVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                         (&local_48,"\"");
      local_68 = &local_58;
      local_70 = (pbVar6->_M_dataplus).super_allocator_type.allocator;
      psVar2 = (size_type *)(pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
           *)psVar2 == paVar7) {
        local_58 = paVar7->_M_allocated_capacity;
        uStack_50 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      }
      else {
        local_58 = paVar7->_M_allocated_capacity;
        local_68 = psVar2;
      }
      local_60 = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
    }
    else {
      local_70 = GetThreadPoolAllocator();
      pcVar3 = (pbVar6->_M_dataplus)._M_p;
      local_68 = &local_58;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *
                          )&local_70,pcVar3,pcVar3 + pbVar6->_M_string_length);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)local_68,(allocator<char> *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getStringNameOrNum(bool quoteStringName = true) const
    {
        if (name != nullptr) {
            TString qstr = quoteStringName ? ("\"" + *name + "\"") : *name;
            std::string ret_str(qstr.c_str());
            return ret_str;
        }
        return std::to_string((long long)string);
    }